

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

void Aig_ManPartitionPrint(Aig_Man_t *p,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int local_34;
  int Counter;
  int nOutputs;
  int i;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vPartSuppsAll_local;
  Vec_Ptr_t *vPartsAll_local;
  Aig_Man_t *p_local;
  
  local_34 = 0;
  for (Counter = 0; iVar1 = Vec_PtrSize(vPartSuppsAll), Counter < iVar1; Counter = Counter + 1) {
    p_00 = (Vec_Int_t *)Vec_PtrEntry(vPartSuppsAll,Counter);
    p_01 = (Vec_Int_t *)Vec_PtrEntry(vPartsAll,Counter);
    uVar2 = Vec_IntSize(p_01);
    uVar3 = Vec_IntSize(p_00);
    printf("%d=(%d,%d) ",(ulong)(uint)Counter,(ulong)uVar3,(ulong)uVar2);
    local_34 = uVar2 + local_34;
    iVar1 = Vec_PtrSize(vPartsAll);
    if (Counter == iVar1 + -1) break;
  }
  iVar1 = Aig_ManCoNum(p);
  if (local_34 == iVar1) {
    return;
  }
  __assert_fail("Counter == Aig_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                ,599,"void Aig_ManPartitionPrint(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Aig_ManPartitionPrint( Aig_Man_t * p, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll )
{
    Vec_Int_t * vOne;
    int i, nOutputs, Counter;

    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        nOutputs = Vec_IntSize((Vec_Int_t *)Vec_PtrEntry(vPartsAll, i));
        printf( "%d=(%d,%d) ", i, Vec_IntSize(vOne), nOutputs );
        Counter += nOutputs;
        if ( i == Vec_PtrSize(vPartsAll) - 1 )
            break;
    }
    assert( Counter == Aig_ManCoNum(p) );
//    printf( "\nTotal = %d. Outputs = %d.\n", Counter, Aig_ManCoNum(p) );
}